

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.cpp
# Opt level: O3

void __thiscall
btGeneric6DofSpring2Constraint::setFrames
          (btGeneric6DofSpring2Constraint *this,btTransform *frameA,btTransform *frameB)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  undefined8 uVar4;
  
  uVar4 = *(undefined8 *)((frameA->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameA->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((frameA->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameA->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((frameA->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameA->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((frameA->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = *(undefined8 *)(frameA->m_origin).m_floats;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((frameB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((frameB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar4;
  uVar4 = *(undefined8 *)((frameB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar4;
  bVar1 = (frameB->m_origin).m_floats[1];
  bVar2 = (frameB->m_origin).m_floats[2];
  bVar3 = (frameB->m_origin).m_floats[3];
  (this->m_frameInB).m_origin.m_floats[0] = (frameB->m_origin).m_floats[0];
  (this->m_frameInB).m_origin.m_floats[1] = bVar1;
  (this->m_frameInB).m_origin.m_floats[2] = bVar2;
  (this->m_frameInB).m_origin.m_floats[3] = bVar3;
  (*(this->super_btTypedConstraint)._vptr_btTypedConstraint[2])();
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  return;
}

Assistant:

void btGeneric6DofSpring2Constraint::setFrames(const btTransform& frameA, const btTransform& frameB)
{
	m_frameInA = frameA;
	m_frameInB = frameB;
	buildJacobian();
	calculateTransforms();
}